

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O1

ostream * wasm::anon_unknown_11::operator<<(ostream *o,Mode *mode)

{
  long lVar1;
  char *pcVar2;
  
  switch(*mode) {
  case Split:
    pcVar2 = "split";
    lVar1 = 5;
    break;
  case MultiSplit:
    pcVar2 = "multi-split";
    lVar1 = 0xb;
    break;
  case Instrument:
    pcVar2 = "instrument";
    lVar1 = 10;
    break;
  case MergeProfiles:
    pcVar2 = "merge-profiles";
    lVar1 = 0xe;
    break;
  case PrintProfile:
    pcVar2 = "print-profile";
    lVar1 = 0xd;
    break;
  default:
    goto switchD_00119c7c_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,lVar1);
switchD_00119c7c_default:
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, WasmSplitOptions::Mode& mode) {
  switch (mode) {
    case WasmSplitOptions::Mode::Split:
      o << "split";
      break;
    case WasmSplitOptions::Mode::MultiSplit:
      o << "multi-split";
      break;
    case WasmSplitOptions::Mode::Instrument:
      o << "instrument";
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      o << "merge-profiles";
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      o << "print-profile";
      break;
  }
  return o;
}